

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::NetState::NetState(NetState *this,NetState *from)

{
  void *pvVar1;
  int iVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__NetState_0071c7b0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->stage_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->stage_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->stage_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->stage_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->stage_).super_RepeatedPtrFieldBase,&(from->stage_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar2 = from->phase_;
  this->level_ = from->level_;
  this->phase_ = iVar2;
  return;
}

Assistant:

NetState::NetState(const NetState& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      stage_(from.stage_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&level_, &from.level_,
    reinterpret_cast<char*>(&phase_) -
    reinterpret_cast<char*>(&level_) + sizeof(phase_));
  // @@protoc_insertion_point(copy_constructor:caffe.NetState)
}